

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMinus<Fad<Fad<double>_>,_FadCst<int>_>::val
          (FadBinaryMinus<Fad<Fad<double>_>,_FadCst<int>_> *this)

{
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_> *in_RSI;
  value_type *in_RDI;
  Fad<double> *unaff_retaddr;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_> *pFVar1;
  value_type *e;
  int a;
  
  pFVar1 = in_RSI;
  e = in_RDI;
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)(in_RSI->fadexpr_).left_);
  a = (int)((ulong)pFVar1 >> 0x20);
  FadCst<int>::val(&(in_RSI->fadexpr_).right_);
  operator-<Fad<double>,_int,_nullptr>(e,a);
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadCst<int>>>
            (unaff_retaddr,(FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_> *)e);
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<int>_>_>::~FadExpr(in_RSI);
  return in_RDI;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}